

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O0

void __thiscall HinOut::compareData(HinOut *this,int lvl)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  reference pvVar5;
  reference pvVar6;
  size_type sVar7;
  type_conflict *ptVar8;
  type *ptVar9;
  int in_ESI;
  int *in_RDI;
  double dVar10;
  size_t l;
  int k_1;
  pair<int,_double> p;
  int k;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> columnOA;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> columnA;
  int j;
  int i;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
  *in_stack_fffffffffffffea8;
  __normal_iterator<const_std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  *in_stack_fffffffffffffeb0;
  value_type *in_stack_fffffffffffffeb8;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
  *in_stack_fffffffffffffec0;
  const_iterator in_stack_fffffffffffffec8;
  value_type in_stack_fffffffffffffed0;
  HinOut *in_stack_fffffffffffffed8;
  ulong local_78;
  int local_70;
  pair<int,_double> local_60;
  int local_4c;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_30;
  int local_14;
  int local_10;
  int local_c;
  
  local_c = in_ESI;
  if (*in_RDI != in_RDI[0x1fc]) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Column counts differ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  if (in_RDI[1] != in_RDI[0x1fd]) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Row counts differ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  if (in_RDI[0x1ea] != in_RDI[0x230]) {
    poVar4 = std::operator<<((ostream *)&std::cout,"AcountX counts differ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  for (local_10 = 0; local_10 < *in_RDI; local_10 = local_10 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)(local_10 + 1));
    iVar1 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)local_10);
    iVar2 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x200),(long)(local_10 + 1));
    iVar3 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x200),(long)local_10);
    if (iVar1 - iVar2 != iVar3 - *pvVar5) {
      poVar4 = std::operator<<((ostream *)&std::cout,"col length different: col[");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
      std::operator<<(poVar4,"]\n");
    }
  }
  std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  for (local_14 = 0; local_14 < *in_RDI; local_14 = local_14 + 1) {
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
              ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x1bb5dc)
    ;
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
              ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x1bb5e9)
    ;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)local_14);
    for (local_4c = *pvVar5; iVar1 = local_4c,
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)(local_14 + 1)),
        iVar1 < *pvVar5; local_4c = local_4c + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc),(long)local_4c);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x12),(long)local_4c)
      ;
      std::pair<int,_double>::pair<int_&,_double_&,_true>(&local_60,pvVar5,pvVar6);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::push_back
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    }
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x200),(long)local_14);
    for (local_70 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x200),
                            (long)(local_14 + 1)), local_70 < *pvVar5; local_70 = local_70 + 1) {
      for (local_78 = 0;
          sVar7 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  size(&local_30), local_78 < sVar7; local_78 = local_78 + 1) {
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (&local_30,local_78);
        ptVar8 = std::get<0ul,int,double>((pair<int,_double> *)0x1bb7bf);
        iVar1 = *ptVar8;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x206),(long)local_70);
        if (iVar1 == *pvVar5) {
          std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                    (&local_30,local_78);
          ptVar9 = std::get<1ul,int,double>((pair<int,_double> *)0x1bb813);
          dVar10 = *ptVar9;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20c),
                              (long)local_70);
          if ((dVar10 != *pvVar6) || (NAN(dVar10) || NAN(*pvVar6))) {
            poVar4 = std::operator<<((ostream *)&std::cout,"mismatch in row ");
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc),(long)local_70);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar5);
            poVar4 = std::operator<<(poVar4," col ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
            poVar4 = std::operator<<(poVar4," in Avalue: ");
            std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            operator[](&local_30,(long)local_10);
            ptVar9 = std::get<1ul,int,double>((pair<int,_double> *)0x1bb96f);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,*ptVar9);
            poVar4 = std::operator<<(poVar4," in oAvalue: ");
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20c),
                                (long)local_70);
            in_stack_fffffffffffffed8 = (HinOut *)std::ostream::operator<<(poVar4,*pvVar6);
            std::ostream::operator<<
                      ((ostream *)in_stack_fffffffffffffed8,std::endl<char,std::char_traits<char>>);
          }
          else {
            std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                      (in_stack_fffffffffffffea8);
            __gnu_cxx::
            __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
            ::operator+((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                         *)in_stack_fffffffffffffeb8,(difference_type)in_stack_fffffffffffffeb0);
            __gnu_cxx::
            __normal_iterator<std::pair<int,double>const*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>
            ::__normal_iterator<std::pair<int,double>*>
                      (in_stack_fffffffffffffeb0,
                       (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                        *)in_stack_fffffffffffffea8);
            std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::erase
                      (in_stack_fffffffffffffec0,in_stack_fffffffffffffec8);
          }
        }
      }
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
              (in_stack_fffffffffffffec0);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
              (in_stack_fffffffffffffec0);
  }
  if (0 < local_c) {
    for (local_10 = 0; local_10 < *in_RDI; local_10 = local_10 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18),(long)local_10)
      ;
      in_stack_fffffffffffffed0 = *pvVar6;
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x212),(long)local_10);
      dVar10 = getdiff(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                       (double)in_stack_fffffffffffffec8._M_current);
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        poVar4 = std::operator<<((ostream *)&std::cout,"colCost[");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
        std::operator<<(poVar4,"]");
      }
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e),(long)local_10)
      ;
      in_stack_fffffffffffffec8._M_current = (pair<int,_double> *)*pvVar6;
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x218),(long)local_10);
      dVar10 = getdiff(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                       (double)in_stack_fffffffffffffec8._M_current);
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        poVar4 = std::operator<<((ostream *)&std::cout,"colLower[");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
        std::operator<<(poVar4,"]");
      }
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x24),(long)local_10);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x21e),(long)local_10);
      dVar10 = getdiff(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                       (double)in_stack_fffffffffffffec8._M_current);
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        poVar4 = std::operator<<((ostream *)&std::cout,"colUpper[");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
        std::operator<<(poVar4,"]");
      }
    }
  }
  if (1 < local_c) {
    for (local_10 = 0; local_10 < in_RDI[1]; local_10 = local_10 + 1) {
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2a),(long)local_10);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x224),(long)local_10);
      dVar10 = getdiff(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                       (double)in_stack_fffffffffffffec8._M_current);
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        poVar4 = std::operator<<((ostream *)&std::cout,"rowLower[");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
        std::operator<<(poVar4,"]");
      }
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x30),(long)local_10);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x22a),(long)local_10);
      dVar10 = getdiff(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                       (double)in_stack_fffffffffffffec8._M_current);
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        poVar4 = std::operator<<((ostream *)&std::cout,"rowUpper[");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
        std::operator<<(poVar4,"]");
      }
    }
  }
  return;
}

Assistant:

void HinOut::compareData(int lvl) {
	int i;
	if (numCol != onumCol)
		cout <<"Column counts differ"<<endl;

	if (numRow != onumRow)
		cout <<"Row counts differ"<<endl;

	if (AcountX != oAcountX)
		cout <<"AcountX counts differ"<<endl;


	//matrix
	for (i=0; i<numCol; i++)
		if (Astart[i+1]-Astart[i] != oAstart[i+1]-oAstart[i])
			cout<<"col length different: col["<<i<<"]\n";

	cout<<flush;

//
//	for (i=0; i<AcountX; i++)
//		if (Aindex[i] != oAindex[i])
//			cout<<"Aindex["<<i<<"]";
//
//	for (i=0; i<AcountX; i++)
//		if (getdiff(Avalue[i] , oAvalue[i]))
//			cout<<"Avalue["<<i<<"]";

	//Aindex and Avalue can differ in their order:
	for (int j=0; j<numCol; j++) {
		vector<pair<int, double>> columnA, columnOA;
		for (int k=Astart[j]; k<Astart[j+1]; k++) {
			pair<int, double> p(Aindex[k], Avalue[k]);
			columnA.push_back(p);
		}

		for (int k=oAstart[j]; k<oAstart[j+1]; k++) {
			//pair<int, double> p(oAindex[k], oAvalue[k]);
			for (size_t l=0;l < columnA.size(); l++)
				if (get<0>(columnA[l])==oAindex[k]) {
					if (get<1>(columnA[l])==oAvalue[k]) {
						columnA.erase(columnA.begin() + l);
						continue;
					}
					else {
						cout<<"mismatch in row "<<Aindex[k]<<" col "<<j<< " in Avalue: "<< get<1>(columnA[i]) << " in oAvalue: "<< oAvalue[k] <<endl;
					}
				}
			//columnOA.push_back(p);
		}
	}






	if (lvl > 0) {


	for (i=0; i<numCol; i++) {
		if (getdiff(colCost[i] , ocolCost[i]))
			cout<<"colCost["<<i<<"]";
		if (getdiff(colLower[i] , ocolLower[i]))
			cout<<"colLower["<<i<<"]";
		if (getdiff(colUpper[i] , ocolUpper[i]))
			cout<<"colUpper["<<i<<"]";

	}

	}
	if (lvl>1) {


	for (i=0; i<numRow; i++) {
		if (getdiff(rowLower[i] , orowLower[i]))
			cout<<"rowLower["<<i<<"]";
		if (getdiff(rowUpper[i] , orowUpper[i]))
			cout<<"rowUpper["<<i<<"]";
	}

	}

}